

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::addChannel(EventLoop *this,ChannelPtr *channel)

{
  element_type *this_00;
  shared_ptr<Channel> local_28;
  ChannelPtr *local_18;
  ChannelPtr *channel_local;
  EventLoop *this_local;
  
  local_18 = channel;
  channel_local = (ChannelPtr *)this;
  assertInLoopThread(this);
  this_00 = std::__shared_ptr_access<EPoller,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<EPoller,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &this->poller_);
  std::shared_ptr<Channel>::shared_ptr(&local_28,channel);
  EPoller::addChannel(this_00,&local_28);
  std::shared_ptr<Channel>::~shared_ptr(&local_28);
  return;
}

Assistant:

void EventLoop::addChannel(ChannelPtr channel) {
    assertInLoopThread();
    poller_->addChannel(std::move(channel));
}